

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_1147904::Target::DumpInstall(Value *__return_storage_ptr__,Target *this)

{
  Value *pVVar1;
  Value local_80;
  Value local_48;
  undefined1 local_19;
  Target *local_18;
  Target *this_local;
  Value *install;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Target *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  DumpInstallPrefix(&local_48,this);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"prefix");
  Json::Value::operator=(pVVar1,&local_48);
  Json::Value::~Value(&local_48);
  DumpInstallDestinations(&local_80,this);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"destinations");
  Json::Value::operator=(pVVar1,&local_80);
  Json::Value::~Value(&local_80);
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::DumpInstall()
{
  Json::Value install = Json::objectValue;
  install["prefix"] = this->DumpInstallPrefix();
  install["destinations"] = this->DumpInstallDestinations();
  return install;
}